

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiWindowSettings * __thiscall
ImChunkStream<ImGuiWindowSettings>::alloc_chunk(ImChunkStream<ImGuiWindowSettings> *this,size_t sz)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  char *__dest;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  iVar2 = (this->Buf).Size;
  uVar6 = (int)sz + 7U & 0xfffffffc;
  iVar4 = iVar2 + uVar6;
  iVar5 = (this->Buf).Capacity;
  if (iVar5 < iVar4) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= iVar4) {
      iVar5 = iVar4;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar5,GImAllocatorUserData);
    pcVar3 = (this->Buf).Data;
    if (pcVar3 != (char *)0x0) {
      memcpy(__dest,pcVar3,(long)(this->Buf).Size);
      pcVar3 = (this->Buf).Data;
      if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
    }
    (this->Buf).Data = __dest;
    (this->Buf).Capacity = iVar5;
  }
  else {
    __dest = (this->Buf).Data;
  }
  (this->Buf).Size = iVar4;
  *(uint *)(__dest + iVar2) = uVar6;
  return (ImGuiWindowSettings *)((this->Buf).Data + (long)iVar2 + 4);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = IM_MEMALIGN(HDR_SZ + sz, 4u); int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }